

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subcommand.c
# Opt level: O0

REF_STATUS multiscale(REF_MPI ref_mpi,int argc,char **argv)

{
  char *pcVar1;
  uint uVar2;
  uint timestep_increment_00;
  uint last_timestep_00;
  uint uVar3;
  REF_STATUS ref_private_macro_code_rss_20;
  REF_STATUS ref_private_macro_code_rss_19;
  REF_STATUS ref_private_macro_code_rss_18;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  char *title [2];
  REF_DBL *hh;
  REF_STATUS ref_private_macro_code_rxs_10;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rxs_9;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rxs_8;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rxs_7;
  REF_DBL strong_value;
  REF_BOOL strong_sensor_bc;
  char in_project [1];
  char *solb_middle;
  REF_INT timestep_increment;
  REF_INT last_timestep;
  REF_INT first_timestep;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  char *tags;
  REF_STATUS ref_private_macro_code_rxs_6;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  char *mapbc;
  REF_STATUS ref_private_macro_code_rxs_5;
  REF_STATUS ref_private_macro_code_rss;
  REF_STATUS ref_private_macro_code_rxs_4;
  REF_STATUS ref_private_macro_code_rxs_3;
  REF_STATUS ref_private_macro_code_rxs_2;
  REF_STATUS ref_private_macro_code_rxs_1;
  REF_STATUS ref_private_macro_code_rxs;
  REF_DICT ref_dict_bcs;
  REF_DBL aspect_ratio;
  REF_INT fixed_point_pos;
  REF_INT hessian_pos;
  REF_INT pos;
  REF_RECON_RECONSTRUCTION reconstruction;
  REF_DBL current_complexity;
  REF_DBL complexity;
  REF_DBL gradation;
  REF_DBL *pRStack_70;
  REF_INT p;
  REF_DBL *metric;
  REF_DBL *scalar;
  REF_GRID_conflict pRStack_58;
  REF_INT ldim;
  REF_GRID_conflict ref_grid;
  char *in_scalar;
  char *in_mesh;
  char *out_metric;
  char **argv_local;
  REF_MPI pRStack_28;
  int argc_local;
  REF_MPI ref_mpi_local;
  
  pRStack_58 = (REF_GRID_conflict)0x0;
  metric = (REF_DBL *)0x0;
  pRStack_70 = (REF_DBL *)0x0;
  hessian_pos = 0;
  ref_dict_bcs = (REF_DICT)0xbff0000000000000;
  _ref_private_macro_code_rxs_1 = (REF_DICT)0x0;
  out_metric = (char *)argv;
  argv_local._4_4_ = argc;
  pRStack_28 = ref_mpi;
  if (argc < 6) {
LAB_00121417:
    if (pRStack_28->id == 0) {
      multiscale_help(*(char **)out_metric);
    }
    return 1;
  }
  in_scalar = argv[2];
  ref_grid = (REF_GRID_conflict)argv[3];
  current_complexity = atof(argv[4]);
  in_mesh = *(char **)(out_metric + 0x28);
  gradation._4_4_ = 2;
  uVar2 = ref_args_find(argv_local._4_4_,(char **)out_metric,"--norm-power",&fixed_point_pos);
  if ((uVar2 != 0) && (uVar2 != 5)) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           0xf3a,"multiscale",(ulong)uVar2,"arg search");
    return uVar2;
  }
  if (fixed_point_pos != -1) {
    if (argv_local._4_4_ + -1 <= fixed_point_pos) {
      if (pRStack_28->id == 0) {
        printf("option missing value: --norm-power <norm power>\n");
      }
      goto LAB_00121417;
    }
    gradation._4_4_ = atoi(*(char **)(out_metric + (long)(fixed_point_pos + 1) * 8));
  }
  complexity = -1.0;
  uVar2 = ref_args_find(argv_local._4_4_,(char **)out_metric,"--gradation",&fixed_point_pos);
  if ((uVar2 != 0) && (uVar2 != 5)) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           0xf46,"multiscale",(ulong)uVar2,"arg search");
    return uVar2;
  }
  if (fixed_point_pos != -1) {
    if (argv_local._4_4_ + -1 <= fixed_point_pos) {
      if (pRStack_28->id == 0) {
        printf("option missing value: --gradation <gradation>\n");
      }
      goto LAB_00121417;
    }
    complexity = atof(*(char **)(out_metric + (long)(fixed_point_pos + 1) * 8));
  }
  uVar2 = ref_args_find(argv_local._4_4_,(char **)out_metric,"--hessian",
                        (REF_INT *)((long)&aspect_ratio + 4));
  if ((uVar2 != 0) && (uVar2 != 5)) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           0xf51,"multiscale",(ulong)uVar2,"arg search");
    return uVar2;
  }
  uVar2 = ref_args_find(argv_local._4_4_,(char **)out_metric,"--fixed-point",
                        (REF_INT *)&aspect_ratio);
  if ((uVar2 != 0) && (uVar2 != 5)) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           0xf53,"multiscale",(ulong)uVar2,"arg search");
    return uVar2;
  }
  ref_dict_bcs = (REF_DICT)0xbff0000000000000;
  uVar2 = ref_args_find(argv_local._4_4_,(char **)out_metric,"--aspect-ratio",&fixed_point_pos);
  if ((uVar2 != 0) && (uVar2 != 5)) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           0xf57,"multiscale",(ulong)uVar2,"arg search");
    return uVar2;
  }
  if (fixed_point_pos != -1) {
    if (argv_local._4_4_ + -1 <= fixed_point_pos) {
      if (pRStack_28->id == 0) {
        printf("option missing value: --aspect-ratio <aspect-ratio>\n");
      }
      goto LAB_00121417;
    }
    ref_dict_bcs = (REF_DICT)atof(*(char **)(out_metric + (long)(fixed_point_pos + 1) * 8));
  }
  uVar2 = ref_dict_create((REF_DICT *)&ref_private_macro_code_rxs_1);
  if (uVar2 == 0) {
    uVar2 = ref_args_find(argv_local._4_4_,(char **)out_metric,"--fun3d-mapbc",&fixed_point_pos);
    if ((uVar2 == 0) || (uVar2 == 5)) {
      if ((fixed_point_pos != -1) && (fixed_point_pos < argv_local._4_4_ + -1)) {
        pcVar1 = *(char **)(out_metric + (long)(fixed_point_pos + 1) * 8);
        if (pRStack_28->id == 0) {
          printf("reading fun3d bc map %s\n",pcVar1);
          uVar2 = ref_phys_read_mapbc(_ref_private_macro_code_rxs_1,pcVar1);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                   ,0xf6a,"multiscale",(ulong)uVar2,"unable to read fun3d formatted mapbc");
            return uVar2;
          }
        }
        uVar2 = ref_dict_bcast(_ref_private_macro_code_rxs_1,pRStack_28);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                 ,0xf6c,"multiscale",(ulong)uVar2,"bcast");
          return uVar2;
        }
      }
      uVar2 = ref_args_find(argv_local._4_4_,(char **)out_metric,"--viscous-tags",&fixed_point_pos);
      if ((uVar2 == 0) || (uVar2 == 5)) {
        if ((fixed_point_pos != -1) && (fixed_point_pos < argv_local._4_4_ + -1)) {
          pcVar1 = *(char **)(out_metric + (long)(fixed_point_pos + 1) * 8);
          if (pRStack_28->id == 0) {
            printf("parsing viscous tags\n");
            uVar2 = ref_phys_parse_tags(_ref_private_macro_code_rxs_1,pcVar1);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0xf77,"multiscale",(ulong)uVar2,"unable to parse viscous tags");
              return uVar2;
            }
            printf(" %d viscous tags parsed\n",(ulong)(uint)_ref_private_macro_code_rxs_1->n);
          }
          uVar2 = ref_dict_bcast(_ref_private_macro_code_rxs_1,pRStack_28);
          if (uVar2 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                   ,0xf7a,"multiscale",(ulong)uVar2,"bcast");
            return uVar2;
          }
        }
        if (pRStack_28->id == 0) {
          printf("complexity %f\n",current_complexity);
          printf("Lp=%d\n",(ulong)gradation._4_4_);
          printf("gradation %f\n",complexity);
          printf("reconstruction %d\n",(ulong)(uint)hessian_pos);
        }
        if (1e-20 < current_complexity) {
          ref_mpi_stopwatch_start(pRStack_28);
          if (pRStack_28->n < 2) {
            if (pRStack_28->id == 0) {
              printf("import %s\n",in_scalar);
            }
            uVar2 = ref_import_by_extension(&stack0xffffffffffffffa8,pRStack_28,in_scalar);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0xf8d,"multiscale",(ulong)uVar2,"import");
              return uVar2;
            }
            ref_mpi_stopwatch_stop(pRStack_28,"import");
          }
          else {
            if (pRStack_28->id == 0) {
              printf("part %s\n",in_scalar);
            }
            uVar2 = ref_part_by_extension(&stack0xffffffffffffffa8,pRStack_28,in_scalar);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0xf89,"multiscale",(ulong)uVar2,"part");
              return uVar2;
            }
            ref_mpi_stopwatch_stop(pRStack_28,"part");
          }
          if (pRStack_28->id == 0) {
            printf("  read %ld vertices\n");
          }
          if (pRStack_58->node->max * 6 < 0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                   ,0xf94,"multiscale","malloc metric of REF_DBL negative");
            ref_mpi_local._4_4_ = 1;
          }
          else {
            pRStack_70 = (REF_DBL *)malloc((long)(pRStack_58->node->max * 6) << 3);
            if (pRStack_70 == (REF_DBL *)0x0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                     ,0xf94,"multiscale","malloc metric of REF_DBL NULL");
              ref_mpi_local._4_4_ = 2;
            }
            else {
              if (aspect_ratio._0_4_ == -1) {
                if (aspect_ratio._4_4_ == -1) {
                  if (pRStack_28->id == 0) {
                    printf("part scalar %s\n",ref_grid);
                  }
                  uVar2 = ref_part_scalar(pRStack_58,(REF_INT *)((long)&scalar + 4),&metric,
                                          (char *)ref_grid);
                  if (uVar2 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                           ,0xfb8,"multiscale",(ulong)uVar2,"part scalar");
                    return uVar2;
                  }
                  if ((long)scalar._4_4_ != 1) {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                           ,0xfb9,"multiscale","expected one scalar",1,(long)scalar._4_4_);
                    return 1;
                  }
                  ref_mpi_stopwatch_stop(pRStack_28,"part scalar");
                  if (pRStack_28->id == 0) {
                    printf("reconstruct Hessian, compute metric\n");
                  }
                  uVar2 = ref_metric_lp(pRStack_70,pRStack_58,metric,hessian_pos,gradation._4_4_,
                                        complexity,(REF_DBL)ref_dict_bcs,current_complexity);
                  if (uVar2 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                           ,0xfbf,"multiscale",(ulong)uVar2,"lp norm");
                    return uVar2;
                  }
                  ref_mpi_stopwatch_stop(pRStack_28,"compute metric");
                  uVar2 = ref_subcommand_report_error
                                    (pRStack_70,pRStack_58,metric,hessian_pos,current_complexity);
                  if (uVar2 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                           ,0xfc3,"multiscale",(ulong)uVar2,"report error");
                    return uVar2;
                  }
                  if (metric != (REF_DBL *)0x0) {
                    free(metric);
                  }
                }
                else {
                  uVar2 = hessian_multiscale(pRStack_28,pRStack_58,(char *)ref_grid,pRStack_70,
                                             gradation._4_4_,complexity,current_complexity);
                  if (uVar2 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                           ,0xfb5,"multiscale",(ulong)uVar2,"hessian multiscale");
                    return uVar2;
                  }
                }
              }
              else {
                memset((void *)((long)&strong_value + 7),0,1);
                strong_value._0_4_ = 0;
                _ref_private_macro_code_rss_7 = 0.0;
                _strong_sensor_bc = *(char **)(out_metric + (long)(aspect_ratio._0_4_ + 1) * 8);
                uVar2 = atoi(*(char **)(out_metric + (long)(aspect_ratio._0_4_ + 2) * 8));
                timestep_increment_00 =
                     atoi(*(char **)(out_metric + (long)(aspect_ratio._0_4_ + 3) * 8));
                last_timestep_00 = atoi(*(char **)(out_metric + (long)(aspect_ratio._0_4_ + 4) * 8))
                ;
                uVar3 = ref_args_find(argv_local._4_4_,(char **)out_metric,"--strong-sensor-bc",
                                      &fixed_point_pos);
                if ((uVar3 != 0) && (uVar3 != 5)) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                         ,0xfa1,"multiscale",(ulong)uVar3,"arg search");
                  return uVar3;
                }
                if (fixed_point_pos != -1) {
                  if (argv_local._4_4_ <= fixed_point_pos + 1) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                           ,0xfa3,"multiscale","--strong-sensor-bc <value>");
                    return 1;
                  }
                  strong_value._0_4_ = 1;
                  _ref_private_macro_code_rss_7 =
                       atof(*(char **)(out_metric + (long)(fixed_point_pos + 1) * 8));
                }
                if (pRStack_28->id == 0) {
                  printf("--fixed-point\n");
                  printf("    %s%s solb project\n",(long)&strong_value + 7,_strong_sensor_bc);
                  printf("    timesteps [%d ... %d ... %d]\n",(ulong)uVar2,
                         (ulong)timestep_increment_00,(ulong)last_timestep_00);
                }
                uVar2 = fixed_point_metric(pRStack_70,pRStack_58,uVar2,last_timestep_00,
                                           timestep_increment_00,(char *)((long)&strong_value + 7),
                                           _strong_sensor_bc,hessian_pos,gradation._4_4_,complexity,
                                           current_complexity,(REF_DBL)ref_dict_bcs,
                                           strong_value._0_4_,_ref_private_macro_code_rss_7,
                                           _ref_private_macro_code_rxs_1);
                if (uVar2 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                         ,0xfb1,"multiscale",(ulong)uVar2,"fixed point");
                  return uVar2;
                }
              }
              uVar2 = ref_args_find(argv_local._4_4_,(char **)out_metric,"--buffer",&fixed_point_pos
                                   );
              if ((uVar2 == 0) || (uVar2 == 5)) {
                if (fixed_point_pos != -1) {
                  if (pRStack_28->id == 0) {
                    printf("buffer at complexity %e\n",current_complexity);
                  }
                  uVar2 = ref_metric_buffer_at_complexity(pRStack_70,pRStack_58,current_complexity);
                  if (uVar2 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                           ,0xfcb,"multiscale",(ulong)uVar2,"buffer at complexity");
                    return uVar2;
                  }
                  ref_mpi_stopwatch_stop(pRStack_28,"buffer");
                }
                uVar2 = ref_args_find(argv_local._4_4_,(char **)out_metric,"--uniform",
                                      &fixed_point_pos);
                if ((uVar2 == 0) || (uVar2 == 5)) {
                  if ((fixed_point_pos == -1) ||
                     (uVar2 = ref_metric_parse(pRStack_70,pRStack_58,argv_local._4_4_,
                                               (char **)out_metric), uVar2 == 0)) {
                    uVar2 = ref_metric_complexity(pRStack_70,pRStack_58,(REF_DBL *)&pos);
                    if (uVar2 == 0) {
                      if (pRStack_28->id == 0) {
                        printf("actual complexity %e\n",_pos);
                      }
                      uVar2 = ref_metric_to_node(pRStack_70,pRStack_58->node);
                      if (uVar2 == 0) {
                        uVar2 = ref_args_find(argv_local._4_4_,(char **)out_metric,"--pcd",
                                              &fixed_point_pos);
                        if ((uVar2 == 0) || (uVar2 == 5)) {
                          if ((fixed_point_pos != -1) && (fixed_point_pos + 1 < argv_local._4_4_)) {
                            _ref_private_macro_code_rss_17 = "spacing";
                            title[0] = "decay";
                            if (pRStack_58->node->max * 2 < 0) {
                              printf("%s: %d: %s: %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                                     ,0xfde,"multiscale","malloc hh of REF_DBL negative");
                              return 1;
                            }
                            title[1] = (char *)malloc((long)(pRStack_58->node->max << 1) << 3);
                            if ((REF_DBL *)title[1] == (REF_DBL *)0x0) {
                              printf("%s: %d: %s: %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                                     ,0xfde,"multiscale","malloc hh of REF_DBL NULL");
                              return 2;
                            }
                            uVar2 = ref_metric_isotropic(pRStack_70,pRStack_58,(REF_DBL *)title[1]);
                            if (uVar2 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                                     ,0xfdf,"multiscale",(ulong)uVar2,"iso");
                              return uVar2;
                            }
                            ref_mpi_stopwatch_stop(pRStack_28,"isotropic");
                            if (pRStack_28->id == 0) {
                              printf("gather %s\n",
                                     *(undefined8 *)(out_metric + (long)(fixed_point_pos + 1) * 8));
                            }
                            uVar2 = ref_gather_scalar_by_extension
                                              (pRStack_58,2,(REF_DBL *)title[1],
                                               (char **)&ref_private_macro_code_rss_17,
                                               *(char **)(out_metric +
                                                         (long)(fixed_point_pos + 1) * 8));
                            if (uVar2 != 0) {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                                     ,0xfe3,"multiscale",(ulong)uVar2,"dump hh");
                              return uVar2;
                            }
                            if (title[1] != (char *)0x0) {
                              free(title[1]);
                            }
                          }
                          if (pRStack_70 != (REF_DBL *)0x0) {
                            free(pRStack_70);
                          }
                          if (pRStack_28->id == 0) {
                            printf("gather %s\n",in_mesh);
                          }
                          uVar2 = ref_gather_metric(pRStack_58,in_mesh);
                          if (uVar2 == 0) {
                            ref_mpi_stopwatch_stop(pRStack_28,"gather metric");
                            uVar2 = ref_dict_free(_ref_private_macro_code_rxs_1);
                            if (uVar2 == 0) {
                              ref_mpi_local._4_4_ = ref_grid_free(pRStack_58);
                              if (ref_mpi_local._4_4_ == 0) {
                                ref_mpi_local._4_4_ = 0;
                              }
                              else {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                                       ,0xfee,"multiscale",(ulong)ref_mpi_local._4_4_,"free grid");
                              }
                            }
                            else {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                                     ,0xfed,"multiscale",(ulong)uVar2,"free");
                              ref_mpi_local._4_4_ = uVar2;
                            }
                          }
                          else {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                                   ,0xfea,"multiscale",(ulong)uVar2,"gather metric");
                            ref_mpi_local._4_4_ = uVar2;
                          }
                        }
                        else {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                                 ,0xfda,"multiscale",(ulong)uVar2,"arg search");
                          ref_mpi_local._4_4_ = uVar2;
                        }
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                               ,0xfd8,"multiscale",(ulong)uVar2,"set node");
                        ref_mpi_local._4_4_ = uVar2;
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                             ,0xfd5,"multiscale",(ulong)uVar2,"cmp");
                      ref_mpi_local._4_4_ = uVar2;
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                           ,0xfd2,"multiscale",(ulong)uVar2,"parse uniform");
                    ref_mpi_local._4_4_ = uVar2;
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                         ,0xfd0,"multiscale",(ulong)uVar2,"arg search");
                  ref_mpi_local._4_4_ = uVar2;
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                       ,0xfc7,"multiscale",(ulong)uVar2,"arg search");
                ref_mpi_local._4_4_ = uVar2;
              }
            }
          }
        }
        else {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                 ,0xf83,"multiscale","complexity must be greater than zero");
          ref_mpi_local._4_4_ = 1;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,0xf70,"multiscale",(ulong)uVar2,"arg search");
        ref_mpi_local._4_4_ = uVar2;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
             0xf63,"multiscale",(ulong)uVar2,"arg search");
      ref_mpi_local._4_4_ = uVar2;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           0xf61,"multiscale",(ulong)uVar2,"make dict");
    ref_mpi_local._4_4_ = uVar2;
  }
  return ref_mpi_local._4_4_;
}

Assistant:

static REF_STATUS multiscale(REF_MPI ref_mpi, int argc, char *argv[]) {
  char *out_metric;
  char *in_mesh;
  char *in_scalar;
  REF_GRID ref_grid = NULL;
  REF_INT ldim;
  REF_DBL *scalar = NULL;
  REF_DBL *metric = NULL;
  REF_INT p;
  REF_DBL gradation, complexity, current_complexity;
  REF_RECON_RECONSTRUCTION reconstruction = REF_RECON_L2PROJECTION;
  REF_INT pos;
  REF_INT hessian_pos, fixed_point_pos;
  REF_DBL aspect_ratio = -1.0;
  REF_DICT ref_dict_bcs = NULL;

  if (argc < 6) goto shutdown;
  in_mesh = argv[2];
  in_scalar = argv[3];
  complexity = atof(argv[4]);
  out_metric = argv[5];

  p = 2;
  RXS(ref_args_find(argc, argv, "--norm-power", &pos), REF_NOT_FOUND,
      "arg search");
  if (REF_EMPTY != pos) {
    if (pos >= argc - 1) {
      if (ref_mpi_once(ref_mpi))
        printf("option missing value: --norm-power <norm power>\n");
      goto shutdown;
    }
    p = atoi(argv[pos + 1]);
  }

  gradation = -1.0;
  RXS(ref_args_find(argc, argv, "--gradation", &pos), REF_NOT_FOUND,
      "arg search");
  if (REF_EMPTY != pos) {
    if (pos >= argc - 1) {
      if (ref_mpi_once(ref_mpi))
        printf("option missing value: --gradation <gradation>\n");
      goto shutdown;
    }
    gradation = atof(argv[pos + 1]);
  }

  RXS(ref_args_find(argc, argv, "--hessian", &hessian_pos), REF_NOT_FOUND,
      "arg search");
  RXS(ref_args_find(argc, argv, "--fixed-point", &fixed_point_pos),
      REF_NOT_FOUND, "arg search");

  aspect_ratio = -1.0;
  RXS(ref_args_find(argc, argv, "--aspect-ratio", &pos), REF_NOT_FOUND,
      "arg search");
  if (REF_EMPTY != pos) {
    if (pos >= argc - 1) {
      if (ref_mpi_once(ref_mpi))
        printf("option missing value: --aspect-ratio <aspect-ratio>\n");
      goto shutdown;
    }
    aspect_ratio = atof(argv[pos + 1]);
  }

  RSS(ref_dict_create(&ref_dict_bcs), "make dict");
  RXS(ref_args_find(argc, argv, "--fun3d-mapbc", &pos), REF_NOT_FOUND,
      "arg search");
  if (REF_EMPTY != pos && pos < argc - 1) {
    const char *mapbc;
    mapbc = argv[pos + 1];
    if (ref_mpi_once(ref_mpi)) {
      printf("reading fun3d bc map %s\n", mapbc);
      RSS(ref_phys_read_mapbc(ref_dict_bcs, mapbc),
          "unable to read fun3d formatted mapbc");
    }
    RSS(ref_dict_bcast(ref_dict_bcs, ref_mpi), "bcast");
  }

  RXS(ref_args_find(argc, argv, "--viscous-tags", &pos), REF_NOT_FOUND,
      "arg search");
  if (REF_EMPTY != pos && pos < argc - 1) {
    const char *tags;
    tags = argv[pos + 1];
    if (ref_mpi_once(ref_mpi)) {
      printf("parsing viscous tags\n");
      RSS(ref_phys_parse_tags(ref_dict_bcs, tags),
          "unable to parse viscous tags");
      printf(" %d viscous tags parsed\n", ref_dict_n(ref_dict_bcs));
    }
    RSS(ref_dict_bcast(ref_dict_bcs, ref_mpi), "bcast");
  }

  if (ref_mpi_once(ref_mpi)) {
    printf("complexity %f\n", complexity);
    printf("Lp=%d\n", p);
    printf("gradation %f\n", gradation);
    printf("reconstruction %d\n", (int)reconstruction);
  }
  RAS(complexity > 1.0e-20, "complexity must be greater than zero");

  ref_mpi_stopwatch_start(ref_mpi);

  if (ref_mpi_para(ref_mpi)) {
    if (ref_mpi_once(ref_mpi)) printf("part %s\n", in_mesh);
    RSS(ref_part_by_extension(&ref_grid, ref_mpi, in_mesh), "part");
    ref_mpi_stopwatch_stop(ref_mpi, "part");
  } else {
    if (ref_mpi_once(ref_mpi)) printf("import %s\n", in_mesh);
    RSS(ref_import_by_extension(&ref_grid, ref_mpi, in_mesh), "import");
    ref_mpi_stopwatch_stop(ref_mpi, "import");
  }
  if (ref_mpi_once(ref_mpi))
    printf("  read " REF_GLOB_FMT " vertices\n",
           ref_node_n_global(ref_grid_node(ref_grid)));

  ref_malloc(metric, 6 * ref_node_max(ref_grid_node(ref_grid)), REF_DBL);

  if (REF_EMPTY != fixed_point_pos) {
    REF_INT first_timestep, last_timestep, timestep_increment;
    const char *solb_middle;
    const char in_project[] = "";
    REF_BOOL strong_sensor_bc = REF_FALSE;
    REF_DBL strong_value = 0.0;
    solb_middle = argv[fixed_point_pos + 1];
    first_timestep = atoi(argv[fixed_point_pos + 2]);
    timestep_increment = atoi(argv[fixed_point_pos + 3]);
    last_timestep = atoi(argv[fixed_point_pos + 4]);
    RXS(ref_args_find(argc, argv, "--strong-sensor-bc", &pos), REF_NOT_FOUND,
        "arg search");
    if (REF_EMPTY != pos) {
      RAS(pos + 1 < argc, "--strong-sensor-bc <value>");
      strong_sensor_bc = REF_TRUE;
      strong_value = atof(argv[pos + 1]);
    }
    if (ref_mpi_once(ref_mpi)) {
      printf("--fixed-point\n");
      printf("    %s%s solb project\n", in_project, solb_middle);
      printf("    timesteps [%d ... %d ... %d]\n", first_timestep,
             timestep_increment, last_timestep);
    }
    RSS(fixed_point_metric(
            metric, ref_grid, first_timestep, last_timestep, timestep_increment,
            in_project, solb_middle, reconstruction, p, gradation, complexity,
            aspect_ratio, strong_sensor_bc, strong_value, ref_dict_bcs),
        "fixed point");
  } else if (REF_EMPTY != hessian_pos) {
    RSS(hessian_multiscale(ref_mpi, ref_grid, in_scalar, metric, p, gradation,
                           complexity),
        "hessian multiscale");
  } else {
    if (ref_mpi_once(ref_mpi)) printf("part scalar %s\n", in_scalar);
    RSS(ref_part_scalar(ref_grid, &ldim, &scalar, in_scalar), "part scalar");
    REIS(1, ldim, "expected one scalar");
    ref_mpi_stopwatch_stop(ref_mpi, "part scalar");

    if (ref_mpi_once(ref_mpi)) printf("reconstruct Hessian, compute metric\n");
    RSS(ref_metric_lp(metric, ref_grid, scalar, reconstruction, p, gradation,
                      aspect_ratio, complexity),
        "lp norm");
    ref_mpi_stopwatch_stop(ref_mpi, "compute metric");
    RSS(ref_subcommand_report_error(metric, ref_grid, scalar, reconstruction,
                                    complexity),
        "report error");
    ref_free(scalar);
  }

  RXS(ref_args_find(argc, argv, "--buffer", &pos), REF_NOT_FOUND, "arg search");
  if (REF_EMPTY != pos) {
    if (ref_mpi_once(ref_mpi)) printf("buffer at complexity %e\n", complexity);
    RSS(ref_metric_buffer_at_complexity(metric, ref_grid, complexity),
        "buffer at complexity");
    ref_mpi_stopwatch_stop(ref_mpi, "buffer");
  }

  RXS(ref_args_find(argc, argv, "--uniform", &pos), REF_NOT_FOUND,
      "arg search");
  if (REF_EMPTY != pos) {
    RSS(ref_metric_parse(metric, ref_grid, argc, argv), "parse uniform");
  }

  RSS(ref_metric_complexity(metric, ref_grid, &current_complexity), "cmp");
  if (ref_mpi_once(ref_mpi))
    printf("actual complexity %e\n", current_complexity);
  RSS(ref_metric_to_node(metric, ref_grid_node(ref_grid)), "set node");

  RXS(ref_args_find(argc, argv, "--pcd", &pos), REF_NOT_FOUND, "arg search");
  if (REF_EMPTY != pos && pos + 1 < argc) {
    REF_DBL *hh;
    const char *title[] = {"spacing", "decay"};
    ref_malloc(hh, 2 * ref_node_max(ref_grid_node(ref_grid)), REF_DBL);
    RSS(ref_metric_isotropic(metric, ref_grid, hh), "iso");
    ref_mpi_stopwatch_stop(ref_mpi, "isotropic");
    if (ref_mpi_once(ref_mpi)) printf("gather %s\n", argv[pos + 1]);
    RSS(ref_gather_scalar_by_extension(ref_grid, 2, hh, title, argv[pos + 1]),
        "dump hh");
    ref_free(hh);
  }

  ref_free(metric);

  if (ref_mpi_once(ref_mpi)) printf("gather %s\n", out_metric);
  RSS(ref_gather_metric(ref_grid, out_metric), "gather metric");
  ref_mpi_stopwatch_stop(ref_mpi, "gather metric");

  RSS(ref_dict_free(ref_dict_bcs), "free");
  RSS(ref_grid_free(ref_grid), "free grid");

  return REF_SUCCESS;
shutdown:
  if (ref_mpi_once(ref_mpi)) multiscale_help(argv[0]);
  return REF_FAILURE;
}